

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_request_completion
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  if ((*(ulong *)&r->field_0x468 >> 0x12 & 1) == 0) {
    *(uint *)v = *(uint *)v & 0xf0000000;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = "";
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 | 2;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = "OK";
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_request_completion(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    if (r->request_complete) {
        v->len = 2;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = (u_char *) "OK";

        return NGX_OK;
    }

    v->len = 0;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = (u_char *) "";

    return NGX_OK;
}